

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O0

void EncodePacketUBX(uchar *packet,int *ppacketlen,int mclass,int mid,uchar *payload,int payloadlen)

{
  uchar local_2e;
  uchar uStack_2d;
  uShort_UBX len;
  int payloadlen_local;
  uchar *payload_local;
  int mid_local;
  int mclass_local;
  int *ppacketlen_local;
  uchar *packet_local;
  
  *packet = 0xb5;
  packet[1] = 'b';
  packet[2] = (uchar)mclass;
  packet[3] = (uchar)mid;
  local_2e = (uchar)payloadlen;
  packet[4] = local_2e;
  uStack_2d = (uchar)((uint)payloadlen >> 8);
  packet[5] = uStack_2d;
  memcpy(packet + 6,payload,(long)payloadlen);
  *ppacketlen = payloadlen + 8;
  SetChecksumUBX(packet,*ppacketlen);
  return;
}

Assistant:

inline void EncodePacketUBX(unsigned char* packet, int* ppacketlen, int mclass, int mid, unsigned char* payload, int payloadlen)
{
	uShort_UBX len;

	packet[0] = SYNC_CHAR_1_UBX;
	packet[1] = SYNC_CHAR_2_UBX;
	packet[2] = (unsigned char)mclass;
	packet[3] = (unsigned char)mid;
	len.v = (unsigned short)payloadlen;
	packet[4] = len.c[0];
	packet[5] = len.c[1];
	memcpy(&packet[MIN_PACKET_LENGTH_UBX-NB_BYTES_CHECKSUM_UBX], payload, payloadlen);
	*ppacketlen = payloadlen+MIN_PACKET_LENGTH_UBX;
	SetChecksumUBX(packet, *ppacketlen);
}